

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O0

void cjson_add_number_should_add_number(void)

{
  cJSON *object;
  cJSON *pcVar1;
  cJSON *number;
  cJSON *root;
  
  object = cJSON_CreateObject();
  cJSON_AddNumberToObject(object,"number",42.0);
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"number");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0xf9);
  }
  UnityAssertEqualNumber((long)pcVar1->type,8,(char *)0x0,0xfb,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(pcVar1->valuedouble * 1e-12,pcVar1->valuedouble,42.0,(char *)0x0,0xfc);
  UnityAssertEqualNumber((long)pcVar1->valueint,0x2a,(char *)0x0,0xfd,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_number_should_add_number(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *number = NULL;

    cJSON_AddNumberToObject(root, "number", 42);

    TEST_ASSERT_NOT_NULL(number = cJSON_GetObjectItemCaseSensitive(root, "number"));

    TEST_ASSERT_EQUAL_INT(number->type, cJSON_Number);
    TEST_ASSERT_EQUAL_DOUBLE(number->valuedouble, 42);
    TEST_ASSERT_EQUAL_INT(number->valueint, 42);

    cJSON_Delete(root);
}